

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

int execute_tests(string *out_name,string *exp_name)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  char *__rhs;
  int __val;
  int __val_00;
  string *this;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string out_line;
  string exp_line;
  string exp_no_comment_name;
  string local_4e0;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ifstream exp_no_comment_file;
  ifstream out_file;
  
  create_file_with_removed_comments(&exp_no_comment_name,exp_name);
  if (exp_no_comment_name._M_string_length == 0) {
    __val = -9999;
  }
  else {
    std::ifstream::ifstream(&out_file,(string *)out_name,_S_in);
    std::ifstream::ifstream(&exp_no_comment_file,(string *)&exp_no_comment_name,_S_in);
    bVar1 = problem_with_file_to_read(&out_file,out_name);
    __val = -9999;
    if (!bVar1) {
      bVar1 = problem_with_file_to_read(&exp_no_comment_file,&exp_no_comment_name);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)&out_line,"executing tests...\n",(allocator *)&exp_line);
        write_colored_text(&out_line,blue);
        std::__cxx11::string::~string((string *)&out_line);
        out_line._M_dataplus._M_p = (pointer)&out_line.field_2;
        out_line._M_string_length = 0;
        exp_line._M_dataplus._M_p = (pointer)&exp_line.field_2;
        exp_line._M_string_length = 0;
        __val_00 = 0;
        out_line.field_2._M_local_buf[0] = '\0';
        exp_line.field_2._M_local_buf[0] = '\0';
        __val = 0;
LAB_00107b8f:
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&out_file,(string *)&out_line);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
          piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&exp_no_comment_file,(string *)&exp_line);
          if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) goto LAB_00107c0f;
          std::__cxx11::string::string
                    ((string *)&local_5a0,"You produced at least one line to much of output: ",
                     (allocator *)&local_560);
          write_colored_text(&local_5a0,red);
          std::__cxx11::string::~string((string *)&local_5a0);
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&out_line);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00107c0b;
        }
        while( true ) {
          piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&exp_no_comment_file,(string *)&exp_line);
          if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
          __val_00 = __val_00 + 1;
          std::__cxx11::to_string(&local_580,__val_00);
          std::operator+(&local_560,"You failed to produce expected line ",&local_580);
          std::operator+(&local_5a0,&local_560,":  ");
          write_colored_text(&local_5a0,red);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_580);
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&exp_line);
          std::endl<char,std::char_traits<char>>(poVar3);
          __val = __val + 1;
        }
        if (__val < 1) {
          std::__cxx11::to_string(&local_580,__val_00);
          std::operator+(&local_560,"Yes, no errors, all ",&local_580);
          std::operator+(&local_5a0,&local_560," lines of output are correct!\n");
          write_colored_text(&local_5a0,green);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_560);
          this = &local_580;
        }
        else {
          std::__cxx11::to_string(&local_4c0,__val);
          std::operator+(&local_4a0,"You produced ",&local_4c0);
          std::operator+(&local_480,&local_4a0," wrong line");
          __rhs = "s";
          if (__val == 1) {
            __rhs = "";
          }
          std::operator+(&local_460,&local_480,__rhs);
          std::operator+(&local_580,&local_460," of totally ");
          std::__cxx11::to_string(&local_4e0,__val_00);
          std::operator+(&local_560,&local_580,&local_4e0);
          std::operator+(&local_5a0,&local_560," lines of expected output!\n");
          write_colored_text(&local_5a0,magenta);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_580);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_480);
          std::__cxx11::string::~string((string *)&local_4a0);
          this = &local_4c0;
        }
        std::__cxx11::string::~string((string *)this);
        std::ifstream::close();
        remove_a_file(&exp_no_comment_name);
        std::ifstream::close();
        std::ifstream::close();
        std::__cxx11::string::~string((string *)&exp_line);
        std::__cxx11::string::~string((string *)&out_line);
      }
    }
    std::ifstream::~ifstream(&exp_no_comment_file);
    std::ifstream::~ifstream(&out_file);
  }
  std::__cxx11::string::~string((string *)&exp_no_comment_name);
  return __val;
LAB_00107c0f:
  __val_00 = __val_00 + 1;
  bVar1 = std::operator!=(&out_line,&exp_line);
  if (bVar1) {
    std::__cxx11::to_string(&local_580,__val_00);
    std::operator+(&local_560,"Error: Line ",&local_580);
    std::operator+(&local_5a0,&local_560,":\t");
    write_colored_text(&local_5a0,red);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::string((string *)&local_5a0,"Expected: ",(allocator *)&local_560);
    write_colored_text(&local_5a0,yellow);
    std::__cxx11::string::~string((string *)&local_5a0);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&exp_line);
    std::operator<<(poVar3,"\t");
    std::__cxx11::string::string((string *)&local_5a0,"Your output: ",(allocator *)&local_560);
    write_colored_text(&local_5a0,cyan);
    std::__cxx11::string::~string((string *)&local_5a0);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&out_line);
    std::endl<char,std::char_traits<char>>(poVar3);
LAB_00107c0b:
    __val = __val + 1;
  }
  goto LAB_00107b8f;
}

Assistant:

int execute_tests(const string &out_name, const string &exp_name) {
    // Open 'out_name' and 'exp_name' for 'r'-access:
    // see https://www.tutorialspoint.com/cplusplus/cpp_files_streams.htm
    // ifstream ... : represents input file stream (for reading from files)
    // ofstream ... : represents output file stream (for creating and writing to files)
    // For comparing, you only need reading:


    // Creating file with removed comments in exp_file:
    string exp_no_comment_name = create_file_with_removed_comments(exp_name);
    if (exp_no_comment_name.empty()) return -9999;


    // Open files for read-access
    ifstream out_file(out_name);
    ifstream exp_no_comment_file(exp_no_comment_name);
    if (problem_with_file_to_read(out_file, out_name)) return -9999;
    if (problem_with_file_to_read(exp_no_comment_file, exp_no_comment_name)) return -9999;


    // Run actual tests: do string-comparison line by line
    write_colored_text("executing tests...\n", blue);
    int line_nr = 0, error_count = 0;
    string out_line, exp_line;

    while (getline(out_file, out_line)) {
        if (getline(exp_no_comment_file, exp_line)) {
            line_nr++;
            /*
             * NOTE: I wanted to compare the two string as described in
             * various online resources, such as https://www.geeksforgeeks.org/stdstringcompare-in-c/
             * With:
             *      if (out_line.compare(exp_line) == 0)
             * But CLion showed "Clang-Tidy: Do not use 'compare' to test equality of strings; use the string
             *      equality operator instead"
             *
             * It seems the above construct would be great to see if a string is shorter or longer than the other:
             *      int difference = out_line.compare(exp_line);
             *
             * But here, I only want to know if they are the same.
             * -> after automatic refactoring
             */
            if (out_line != exp_line) {
                write_colored_text("Error: Line " + to_string(line_nr) + ":\t");
                write_colored_text("Expected: ", yellow);
                cout << exp_line << "\t";
                write_colored_text("Your output: ", cyan);
                cout << out_line << endl;
                error_count++;
            }
        } else {
            write_colored_text("You produced at least one line to much of output: ");
            cout << out_line << endl;
            error_count++;
        }
    }

    // Check, if 'expected' has more lines than 'out':
    while (getline(exp_no_comment_file, exp_line)) {
        line_nr++;
        write_colored_text("You failed to produce expected line " + to_string(line_nr) + ":  ");
        cout << exp_line << endl;
        error_count++;
    }

    if (error_count > 0) {
        write_colored_text(
                "You produced " + to_string(error_count) + " wrong line" + (error_count == 1 ? "" : "s") +
                " of totally " + to_string(line_nr) + " lines of expected output!\n",
                magenta);
    } else {
        write_colored_text("Yes, no errors, all " + to_string(line_nr) + " lines of output are correct!\n",
                           green);
    }

    // Remove the file without comments
    exp_no_comment_file.close();
    remove_a_file(exp_no_comment_name);

    out_file.close();
    exp_no_comment_file.close();

    return error_count;
}